

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

void __thiscall cmCTestGIT::CommitParser::ParsePerson(CommitParser *this,char *str,Person *person)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  char *local_40;
  char *local_38;
  
  while ((*str != '\0' && (bVar2 = cmIsSpace(*str), bVar2))) {
    str = str + 1;
  }
  lVar7 = 0;
  for (lVar4 = 0; (str[lVar4] != '\0' && (str[lVar4] != '<')); lVar4 = lVar4 + 1) {
    lVar7 = lVar7 + -1;
  }
  local_40 = str + -lVar7;
  pcVar8 = local_40 + 1;
  lVar5 = lVar7;
  local_38 = local_40;
  do {
    if (lVar5 == 0) break;
    bVar2 = cmIsSpace(pcVar8[-2]);
    pcVar8 = pcVar8 + -1;
    lVar5 = lVar5 + 1;
  } while (bVar2);
  std::__cxx11::string::assign((char *)person,(ulong)str);
  pcVar8 = local_38;
  pcVar6 = local_38;
  if (str[lVar4] != '\0') {
    pcVar8 = str + (1 - lVar7);
    pcVar6 = pcVar8;
  }
  do {
    cVar1 = *pcVar8;
    if (cVar1 == '\0') break;
    pcVar8 = pcVar8 + 1;
  } while (cVar1 != '>');
  local_40 = pcVar8;
  std::__cxx11::string::assign((char *)&person->EMail,(ulong)pcVar6);
  uVar3 = strtoul(pcVar8,&local_40,10);
  person->Time = uVar3;
  lVar4 = strtol(local_40,&local_40,10);
  person->TimeZone = lVar4;
  return;
}

Assistant:

void ParsePerson(const char* str, Person& person)
  {
    // Person Name <person@domain.com> 1234567890 +0000
    const char* c = str;
    while (*c && cmIsSpace(*c)) {
      ++c;
    }

    const char* name_first = c;
    while (*c && *c != '<') {
      ++c;
    }
    const char* name_last = c;
    while (name_last != name_first && cmIsSpace(*(name_last - 1))) {
      --name_last;
    }
    person.Name.assign(name_first, name_last - name_first);

    const char* email_first = *c ? ++c : c;
    while (*c && *c != '>') {
      ++c;
    }
    const char* email_last = *c ? c++ : c;
    person.EMail.assign(email_first, email_last - email_first);

    person.Time = strtoul(c, const_cast<char**>(&c), 10);
    person.TimeZone = strtol(c, const_cast<char**>(&c), 10);
  }